

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

complex<double> helics::helicsGetComplex(string_view val)

{
  double __r;
  string_view V;
  string_view V_00;
  string_view V_01;
  string_view V_02;
  string_view V_03;
  string_view val_00;
  string_view trimCharacters;
  string_view trimCharacters_00;
  bool bVar1;
  const_reference pvVar2;
  undefined8 extraout_RAX;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  size_type sVar6;
  const_reference this;
  reference pcVar7;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  char *in_RSI;
  size_t in_RDI;
  complex<double> cVar8;
  invalid_argument *anon_var_0;
  string_view strval_1;
  basic_string_view<char,_std::char_traits<char>_> strval;
  string temp;
  smatch match;
  vector<double,_std::allocator<double>_> vectorVal;
  size_type sep;
  double imag;
  double real;
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  match_flag_type in_stack_fffffffffffffdfc;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe00;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  allocator<char> *in_stack_fffffffffffffe20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  string_view *in_stack_fffffffffffffe40;
  allocator<char> *paVar9;
  char *in_stack_fffffffffffffe50;
  allocator<char> local_e1 [65];
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined4 local_80;
  size_t local_70;
  char *local_68;
  vector<double,_std::allocator<double>_> local_60;
  size_t local_48;
  char *local_40;
  size_type local_38;
  double local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  complex<double> local_10;
  
  local_20._M_len = in_RDI;
  local_20._M_str = in_RSI;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_20);
  if (bVar1) {
    cVar8 = invalidValue<std::complex<double>>();
  }
  else {
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               invalidValue<double>();
    local_30 = 0.0;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_20);
    if (*pvVar2 == '[') {
      local_38 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                           ((basic_string_view<char,_std::char_traits<char>_> *)
                            in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef,0x32503f);
      if (local_38 == 0xffffffffffffffff) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_20,1);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_20,1);
        local_48 = local_20._M_len;
        local_40 = local_20._M_str;
        V._M_len._4_4_ = in_stack_fffffffffffffdfc;
        V._M_len._0_4_ = in_stack_fffffffffffffdf8;
        V._M_str = (char *)in_stack_fffffffffffffe00;
        local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gmlc::utilities::numConv<double>(V);
        std::complex<double>::complex(&local_10,(double)local_28,local_30);
        cVar8._M_value._8_8_ = extraout_RDX;
        cVar8._M_value._0_8_ = extraout_RAX;
      }
      else {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffdf0,in_stack_fffffffffffffdef,0x3250fa);
        if (sVar3 == 0xffffffffffffffff) {
          local_90 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
                                (size_type)in_stack_fffffffffffffe00);
          V_00._M_len._4_4_ = in_stack_fffffffffffffdfc;
          V_00._M_len._0_4_ = in_stack_fffffffffffffdf8;
          V_00._M_str = (char *)in_stack_fffffffffffffe00;
          local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gmlc::utilities::numConv<double>(V_00);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_20,1);
          local_a0 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08,
                                (size_type)in_stack_fffffffffffffe00);
          V_01._M_len._4_4_ = in_stack_fffffffffffffdfc;
          V_01._M_len._0_4_ = in_stack_fffffffffffffdf8;
          V_01._M_str = (char *)in_stack_fffffffffffffe00;
          local_30 = gmlc::utilities::numConv<double>(V_01);
          std::complex<double>::complex(&local_10,(double)local_28,local_30);
          cVar8._M_value._8_8_ = extraout_RDX_01;
          cVar8._M_value._0_8_ = extraout_RAX_01;
        }
        else {
          local_70 = local_20._M_len;
          local_68 = local_20._M_str;
          val_00._M_str = (char *)in_stack_fffffffffffffe28;
          val_00._M_len = (size_t)in_stack_fffffffffffffe20;
          helicsGetVector(val_00);
          sVar4 = CLI::std::vector<double,_std::allocator<double>_>::size(&local_60);
          if (sVar4 < 2) {
            invalidValue<std::complex<double>>();
          }
          else {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&local_60,0);
            __r = *pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)&local_60,1);
            std::complex<double>::complex(&local_10,__r,*pvVar5);
          }
          local_80 = 1;
          CLI::std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00);
          cVar8._M_value._8_8_ = extraout_RDX_00;
          cVar8._M_value._0_8_ = extraout_RAX_00;
        }
      }
    }
    else {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)in_stack_fffffffffffffdf0);
      paVar9 = local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::allocator<char>::~allocator(local_e1);
      std::
      regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                 in_stack_fffffffffffffdfc);
      sVar6 = std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffdf0);
      if (sVar6 == 9) {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffe00,
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        std::__cxx11::sub_match::operator_cast_to_string
                  ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gmlc::utilities::numConv<double>((string *)0x3253ac);
        std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffe00,
                     CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        std::__cxx11::sub_match::operator_cast_to_string
                  ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        local_30 = gmlc::utilities::numConv<double>((string *)0x32540a);
        std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
        this = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)in_stack_fffffffffffffe00,
                            CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        pcVar7 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)this);
        if (*pcVar7 == '-') {
          local_30 = -local_30;
        }
      }
      else {
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_20);
        if ((*pvVar2 == 'j') ||
           (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back
                               ((basic_string_view<char,_std::char_traits<char>_> *)&local_20),
           *pvVar2 == 'i')) {
          this_00 = &local_20;
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
          std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe10,
                     (size_type)in_stack_fffffffffffffe08,(size_type)this_00);
          trimCharacters._M_str = in_stack_fffffffffffffe50;
          trimCharacters._M_len = (size_t)paVar9;
          gmlc::utilities::string_viewOps::trimString(in_stack_fffffffffffffe40,trimCharacters);
          V_02._M_len._4_4_ = in_stack_fffffffffffffdfc;
          V_02._M_len._0_4_ = in_stack_fffffffffffffdf8;
          V_02._M_str = (char *)this_00;
          local_30 = gmlc::utilities::numConv<double>(V_02);
          local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          trimCharacters_00._M_str = in_stack_fffffffffffffe50;
          trimCharacters_00._M_len = (size_t)paVar9;
          gmlc::utilities::string_viewOps::trimString(in_stack_fffffffffffffe40,trimCharacters_00);
          V_03._M_len._4_4_ = in_stack_fffffffffffffdfc;
          V_03._M_len._0_4_ = in_stack_fffffffffffffdf8;
          V_03._M_str = (char *)in_stack_fffffffffffffe00;
          in_stack_fffffffffffffdf0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               gmlc::utilities::numConv<double>(V_03);
          local_28 = in_stack_fffffffffffffdf0;
        }
      }
      std::complex<double>::complex(&local_10,(double)local_28,local_30);
      local_80 = 1;
      std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x3255b8);
      cVar8._M_value._8_8_ = extraout_RDX_02;
      cVar8._M_value._0_8_ = extraout_RAX_02;
    }
  }
  return (complex<double>)cVar8._M_value;
}

Assistant:

std::complex<double> helicsGetComplex(std::string_view val)
{
    if (val.empty()) {
        return invalidValue<std::complex<double>>();
    }
    double real{invalidValue<double>()};
    double imag{0.0};
    if (val.front() == '[') {
        auto sep = val.find_first_of(',');
        if (sep == std::string_view::npos) {
            val.remove_prefix(1);
            val.remove_suffix(1);
            real = numConv<double>(val);
            return {real, imag};
        }
        if (val.find_first_of(',', sep + 1) != std::string_view::npos) {
            auto vectorVal = helicsGetVector(val);
            if (vectorVal.size() >= 2) {
                return {vectorVal[0], vectorVal[1]};
            }
            return invalidValue<std::complex<double>>();
        }
        real = numConv<double>(val.substr(1, sep));
        val.remove_suffix(1);
        imag = numConv<double>(val.substr(sep + 1));
        return {real, imag};
    }
    std::smatch match;

    auto temp = std::string(val);
    std::regex_search(temp, match, creg);
    try {
        if (match.size() == 9) {
            real = numConv<double>(match[1]);

            imag = numConv<double>(match[6]);

            if (*match[5].first == '-') {
                imag = -imag;
            }
        } else {
            if ((val.back() == 'j') || (val.back() == 'i')) {
                auto strval = val.substr(0, val.size() - 1);
                string_viewOps::trimString(strval);
                imag = numConv<double>(strval);
                real = 0.0;
            } else {
                auto strval = val;
                string_viewOps::trimString(strval);
                real = numConv<double>(strval);
            }
        }
    }
    catch (const std::invalid_argument&) {
        real = invalidValue<double>();
    }
    return {real, imag};
}